

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SeparatedSyntaxList<slang::syntax::PropertyExprSyntax> * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SeparatedSyntaxList<slang::syntax::PropertyExprSyntax>,slang::syntax::SeparatedSyntaxList<slang::syntax::PropertyExprSyntax>const&>
          (BumpAllocator *this,SeparatedSyntaxList<slang::syntax::PropertyExprSyntax> *args)

{
  SeparatedSyntaxList<slang::syntax::PropertyExprSyntax> *pSVar1;
  SeparatedSyntaxList<slang::syntax::PropertyExprSyntax> *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pSVar1 = (SeparatedSyntaxList<slang::syntax::PropertyExprSyntax> *)
           allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::SeparatedSyntaxList<slang::syntax::PropertyExprSyntax>::SeparatedSyntaxList
            (in_RSI,pSVar1);
  return pSVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }